

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O2

bool dg::pta::PointerAnalysisFSInv::containsRemovableLocals(PSNode *where,PointsToSetT *S)

{
  bool bVar1;
  bool bVar2;
  PSNode *node;
  Pointer PVar3;
  const_iterator __begin2;
  const_iterator local_48;
  
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::begin(&local_48,&S->pointers);
  while( true ) {
    bVar1 = local_48.container_it.
            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
            != (__node_type *)0x0 || local_48.pos != 0;
    if (local_48.container_it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur ==
        (__node_type *)0x0 && local_48.pos == 0) {
      return bVar1;
    }
    PVar3 = PointerIdPointsToSet::const_iterator::operator*((const_iterator *)&local_48);
    node = PVar3.target;
    if ((((((node != NULLPTR) && (node != UNKNOWN_MEMORY)) && (node != INVALIDATED)) &&
         ((node != (PSNode *)0x0 && (*(int *)(node + 0x90) == 1)))) &&
        ((node[0xe9] == (PSNode)0x0 &&
         ((node[0xea] == (PSNode)0x0 && (*(long *)(node + 0xa0) == *(long *)(where + 0xa0))))))) &&
       (bVar2 = knownInstance(node), bVar2)) break;
    ADT::
    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
    ::const_iterator::operator++(&local_48);
  }
  return bVar1;
}

Assistant:

static bool containsRemovableLocals(PSNode *where, PointsToSetT &S) {
        for (const auto &ptr : S) {
            if (ptr.isNull() || ptr.isUnknown() || ptr.isInvalidated())
                continue;

            if (PSNodeAlloc *alloc = PSNodeAlloc::get(ptr.target)) {
                if (isLocal(alloc, where) && knownInstance(alloc))
                    return true;
            }
        }

        return false;
    }